

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O2

void __thiscall Refal2::COperationsExecuter::matchRightBegin_E(COperationsExecuter *this)

{
  this->operation = this->operation->next;
  saveState(this);
  this->operation = this->operation->next;
  return;
}

Assistant:

inline void COperationsExecuter::matchRightBegin_E()
{
	nextOperation();
	saveState();
	nextOperation();
}